

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniset.cpp
# Opt level: O3

UBool __thiscall icu_63::UnicodeSet::matchesIndexValue(UnicodeSet *this,uint8_t v)

{
  uint uVar1;
  uint uVar2;
  UChar32 UVar3;
  UnicodeString *this_00;
  int32_t index;
  ulong uVar4;
  UVector *this_01;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  
  if (1 < this->len) {
    uVar2 = (uint)v;
    uVar4 = 0;
    do {
      uVar1 = this->list[uVar4 * 2];
      uVar5 = this->list[uVar4 * 2 + 1] - 1;
      uVar7 = uVar1 & 0xff;
      uVar6 = uVar5 & 0xff;
      if ((uVar5 ^ uVar1) < 0x100) {
        if ((uVar7 <= uVar2) && (uVar2 <= uVar6)) goto LAB_002c1d59;
      }
      else {
        index = 1;
        if ((uVar7 <= uVar2) || (uVar2 <= uVar6)) goto LAB_002c1d5c;
      }
      uVar4 = uVar4 + 1;
    } while ((uint)this->len >> 1 != uVar4);
  }
  this_01 = this->strings;
  index = 0;
  if (0 < this_01->count) {
    do {
      this_00 = (UnicodeString *)UVector::elementAt(this_01,index);
      UVar3 = UnicodeString::char32At(this_00,0);
      if ((uint8_t)UVar3 == v) goto LAB_002c1d59;
      index = index + 1;
      this_01 = this->strings;
    } while (index < this_01->count);
    index = 0;
  }
LAB_002c1d5c:
  return (UBool)index;
LAB_002c1d59:
  index = 1;
  goto LAB_002c1d5c;
}

Assistant:

UBool UnicodeSet::matchesIndexValue(uint8_t v) const {
    /* The index value v, in the range [0,255], is contained in this set if
     * it is contained in any pair of this set.  Pairs either have the high
     * bytes equal, or unequal.  If the high bytes are equal, then we have
     * aaxx..aayy, where aa is the high byte.  Then v is contained if xx <=
     * v <= yy.  If the high bytes are unequal we have aaxx..bbyy, bb>aa.
     * Then v is contained if xx <= v || v <= yy.  (This is identical to the
     * time zone month containment logic.)
     */
    int32_t i;
    int32_t rangeCount=getRangeCount();
    for (i=0; i<rangeCount; ++i) {
        UChar32 low = getRangeStart(i);
        UChar32 high = getRangeEnd(i);
        if ((low & ~0xFF) == (high & ~0xFF)) {
            if ((low & 0xFF) <= v && v <= (high & 0xFF)) {
                return TRUE;
            }
        } else if ((low & 0xFF) <= v || v <= (high & 0xFF)) {
            return TRUE;
        }
    }
    if (strings->size() != 0) {
        for (i=0; i<strings->size(); ++i) {
            const UnicodeString& s = *(const UnicodeString*)strings->elementAt(i);
            //if (s.length() == 0) {
            //    // Empty strings match everything
            //    return TRUE;
            //}
            // assert(s.length() != 0); // We enforce this elsewhere
            UChar32 c = s.char32At(0);
            if ((c & 0xFF) == v) {
                return TRUE;
            }
        }
    }
    return FALSE;
}